

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::Options
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,RegexFlags *flags)

{
  StandardChars<char16_t> *pSVar1;
  RegexFlags RVar2;
  bool bVar3;
  EncodedChar EVar4;
  EncodedChar EVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ThreadConfiguration *pTVar10;
  CharCount n;
  
LAB_00d2871b:
  n = 1;
  EVar4 = ECLookahead(this,0);
  if (EVar4 == L'\\') {
    EVar4 = L'\\';
    if ((this->next + 6 <= this->inputLim) && (EVar5 = ECLookahead(this,1), EVar5 == L'u')) {
      pSVar1 = this->standardEncodedChars;
      EVar5 = ECLookahead(this,2);
      bVar3 = StandardChars<char16_t>::IsHex(pSVar1,EVar5);
      if (bVar3) {
        pSVar1 = this->standardEncodedChars;
        EVar5 = ECLookahead(this,3);
        bVar3 = StandardChars<char16_t>::IsHex(pSVar1,EVar5);
        if (bVar3) {
          pSVar1 = this->standardEncodedChars;
          EVar5 = ECLookahead(this,4);
          bVar3 = StandardChars<char16_t>::IsHex(pSVar1,EVar5);
          if (bVar3) {
            pSVar1 = this->standardEncodedChars;
            EVar5 = ECLookahead(this,5);
            bVar3 = StandardChars<char16_t>::IsHex(pSVar1,EVar5);
            n = 1;
            if (bVar3) {
              if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == false) {
                pSVar1 = this->standardEncodedChars;
                EVar4 = ECLookahead(this,2);
                uVar6 = StandardChars<char16_t>::DigitValue(pSVar1,EVar4);
                pSVar1 = this->standardEncodedChars;
                EVar4 = ECLookahead(this,3);
                uVar7 = StandardChars<char16_t>::DigitValue(pSVar1,EVar4);
                pSVar1 = this->standardEncodedChars;
                EVar4 = ECLookahead(this,4);
                uVar8 = StandardChars<char16_t>::DigitValue(pSVar1,EVar4);
                pSVar1 = this->standardEncodedChars;
                EVar4 = ECLookahead(this,5);
                uVar9 = StandardChars<char16_t>::DigitValue(pSVar1,EVar4);
                EVar4 = Chars<char16_t>::UTC(uVar8 << 4 | uVar9 | uVar6 << 0xc | uVar7 << 8);
                n = 6;
                goto LAB_00d288a4;
              }
              goto LAB_00d289bf;
            }
            goto LAB_00d288a4;
          }
        }
      }
      n = 1;
    }
  }
  else {
    n = 1;
    if (EVar4 == L'\0') {
      return;
    }
  }
LAB_00d288a4:
  switch((ushort)EVar4 - 0x67 >> 1 | (uint)(((ushort)EVar4 - 0x67 & 1) != 0) << 0x1f) {
  case 0:
    RVar2 = *flags;
    if ((RVar2 & GlobalRegexFlag) != NoRegexFlags) {
      Fail(this,-0x7ff5ec67);
      RVar2 = *flags;
    }
    RVar2 = RVar2 | GlobalRegexFlag;
    break;
  case 1:
    RVar2 = *flags;
    if ((RVar2 & IgnoreCaseRegexFlag) != NoRegexFlags) {
      Fail(this,-0x7ff5ec67);
      RVar2 = *flags;
    }
    RVar2 = RVar2 | IgnoreCaseRegexFlag;
    break;
  default:
switchD_00d288be_caseD_2:
    bVar3 = StandardChars<char16_t>::IsWord(this->standardChars,EVar4);
    if (!bVar3) {
      return;
    }
LAB_00d289bf:
    Fail(this,-0x7ff5ec67);
    return;
  case 3:
    RVar2 = *flags;
    if ((RVar2 & MultilineRegexFlag) != NoRegexFlags) {
      Fail(this,-0x7ff5ec67);
      RVar2 = *flags;
    }
    RVar2 = RVar2 | MultilineRegexFlag;
    break;
  case 6:
    pTVar10 = (this->scriptContext->config).threadConfig;
    if (pTVar10->m_ES2018RegExDotAll != true) goto LAB_00d2895b;
    RVar2 = *flags;
    if ((RVar2 & DotAllRegexFlag) != NoRegexFlags) {
      Fail(this,-0x7ff5ec67);
      RVar2 = *flags;
    }
    RVar2 = RVar2 | DotAllRegexFlag;
    break;
  case 7:
    pTVar10 = (this->scriptContext->config).threadConfig;
LAB_00d2895b:
    if (pTVar10->m_ES6Unicode != true) goto LAB_00d2897c;
    RVar2 = *flags;
    if ((RVar2 & UnicodeRegexFlag) != NoRegexFlags) {
      Fail(this,-0x7ff5ec67);
      RVar2 = *flags;
    }
    RVar2 = RVar2 | UnicodeRegexFlag;
    break;
  case 9:
    pTVar10 = (this->scriptContext->config).threadConfig;
LAB_00d2897c:
    if (pTVar10->m_ES6RegExSticky != true) goto switchD_00d288be_caseD_2;
    RVar2 = *flags;
    if ((RVar2 & StickyRegexFlag) != NoRegexFlags) {
      Fail(this,-0x7ff5ec67);
      RVar2 = *flags;
    }
    RVar2 = RVar2 | StickyRegexFlag;
  }
  *flags = RVar2;
  ECConsume(this,n);
  goto LAB_00d2871b;
}

Assistant:

void Parser<P, IsLiteral>::Options(RegexFlags& flags)
    {
        while (true)
        {
            // Could be terminating 0
            EncodedChar ec = ECLookahead();
            CharCount consume;
            Char c;

            if (ec == 0)
                // Embedded 0 not valid
                return;
            else if (IsLiteral &&
                ec == '\\' &&
                ECCanConsume(6) &&
                ECLookahead(1) == 'u' &&
                standardEncodedChars->IsHex(ECLookahead(2)) &&
                standardEncodedChars->IsHex(ECLookahead(3)) &&
                standardEncodedChars->IsHex(ECLookahead(4)) &&
                standardEncodedChars->IsHex(ECLookahead(5)))
            {
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    Fail(JSERR_RegExpSyntax);
                    return;
                }
                else
                {
                    uint32 n = (standardEncodedChars->DigitValue(ECLookahead(2)) << 12) |
                               (standardEncodedChars->DigitValue(ECLookahead(3)) << 8) |
                               (standardEncodedChars->DigitValue(ECLookahead(4)) << 4) |
                               (standardEncodedChars->DigitValue(ECLookahead(5)));
                    c = UTC(n);
                    consume = 6;
                }
            }
            else
            {
                c = Chars<EncodedChar>::CTW(ec);
                consume = 1;
            }

            switch (c) {
            case 'i':
                if ((flags & IgnoreCaseRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | IgnoreCaseRegexFlag);
                break;
            case 'g':
                if ((flags & GlobalRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | GlobalRegexFlag);
                break;
            case 'm':
                if ((flags & MultilineRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | MultilineRegexFlag);
                break;
            case 's':
                if (scriptContext->GetConfig()->IsES2018RegExDotAllEnabled())
                {
                    if ((flags & DotAllRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | DotAllRegexFlag);
                    break;
                }
            case 'u':
                // If we don't have unicode enabled, fall through to default
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    if ((flags & UnicodeRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | UnicodeRegexFlag);
                    // For telemetry
                    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, UnicodeRegexFlag, scriptContext);

                    break;
                }
            case 'y':
                if (scriptContext->GetConfig()->IsES6RegExStickyEnabled())
                {
                    if ((flags & StickyRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | StickyRegexFlag);
                    // For telemetry
                    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, StickyRegexFlag, scriptContext);

                    break;
                }
            default:
                if (standardChars->IsWord(c))
                {
                    // Outer context could never parse this character. Signal the syntax error as
                    // being part of the regex.
                    Fail(JSERR_RegExpSyntax);
                }
                return;
            }

            ECConsume(consume);
        }
    }